

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

char * __thiscall Indexer::index(Indexer *this,char *__s,int __c)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  empty_file_error *e;
  file_open_error *e_1;
  invalid_filename_error *e_2;
  uint64_t file_size;
  DatasetBuilder *builder;
  DatasetBuilder *in_stack_000001c8;
  Indexer *in_stack_000001d0;
  path *in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff40;
  uint64_t in_stack_ffffffffffffff48;
  DatasetBuilder *in_stack_ffffffffffffff50;
  path local_60;
  ulong local_20;
  DatasetBuilder *local_18;
  char *local_10;
  Indexer *local_8;
  
  local_18 = &this->flat_builder;
  local_10 = __s;
  local_8 = this;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_ffffffffffffff40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  uVar2 = std::experimental::filesystem::v1::file_size(&local_60);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_ffffffffffffff20);
  if (0x1400000 < uVar2) {
    local_18 = &this->bitmap_builder;
  }
  local_20 = uVar2;
  bVar1 = DatasetBuilder::can_still_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __c_00 = extraout_EDX;
  if (!bVar1) {
    make_spill(in_stack_000001d0,in_stack_000001c8);
    __c_00 = extraout_EDX_00;
  }
  pcVar3 = DatasetBuilder::index(local_18,local_10,__c_00);
  return pcVar3;
}

Assistant:

void Indexer::index(const std::string &target) {
    DatasetBuilder *builder = &flat_builder;

    try {
        uint64_t file_size = fs::file_size(target);

        if (file_size > 1024 * 1024 * 20) {
            builder = &bitmap_builder;
        }

        if (!builder->can_still_add(file_size)) {
            make_spill(*builder);
        }

        builder->index(target);
    } catch (empty_file_error &e) {
        spdlog::debug("Empty file (skip): {}", target);
    } catch (file_open_error &e) {
        spdlog::warn("Failed to open {} reason: {}", target, e.what());
    } catch (invalid_filename_error &e) {
        spdlog::warn("Illegal file name (skip): {}", target);
    }
}